

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O0

Precision *
icu_63::number::Precision::constructFractionSignificant
          (Precision *__return_storage_ptr__,FractionPrecision *base,int32_t minSig,int32_t maxSig)

{
  PrecisionType local_34;
  undefined1 local_30 [8];
  PrecisionUnion union_;
  FractionSignificantSettings settings;
  int32_t maxSig_local;
  int32_t minSig_local;
  FractionPrecision *base_local;
  
  union_._8_4_ = (undefined4)*(undefined8 *)&(base->super_Precision).fUnion;
  union_._12_2_ = (short)minSig;
  union_._14_2_ = (short)maxSig;
  local_30 = (undefined1  [8])union_._8_8_;
  local_34 = RND_FRACTION_SIGNIFICANT;
  settings._0_4_ = maxSig;
  settings._4_4_ = minSig;
  Precision(__return_storage_ptr__,&local_34,(PrecisionUnion *)local_30,UNUM_FOUND_HALFEVEN);
  return __return_storage_ptr__;
}

Assistant:

Precision
Precision::constructFractionSignificant(const FractionPrecision &base, int32_t minSig, int32_t maxSig) {
    FractionSignificantSettings settings = base.fUnion.fracSig;
    settings.fMinSig = static_cast<digits_t>(minSig);
    settings.fMaxSig = static_cast<digits_t>(maxSig);
    PrecisionUnion union_;
    union_.fracSig = settings;
    return {RND_FRACTION_SIGNIFICANT, union_, kDefaultMode};
}